

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_257,_false,_embree::sse42::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  RayQueryContext *extraout_RDX;
  ulong uVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  uint uVar21;
  float fVar38;
  float fVar41;
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar39;
  uint uVar40;
  float fVar42;
  uint uVar43;
  float fVar44;
  uint uVar45;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_2;
  float fVar46;
  uint uVar47;
  float fVar48;
  float fVar51;
  float fVar54;
  vint4 ai_1;
  uint uVar52;
  float fVar53;
  uint uVar55;
  float fVar56;
  uint uVar57;
  float fVar58;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar59;
  float fVar63;
  float fVar64;
  vfloat4 a0;
  undefined1 auVar60 [16];
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  uint uVar67;
  float fVar68;
  float fVar71;
  float fVar74;
  vint4 ai_3;
  uint uVar72;
  float fVar73;
  uint uVar75;
  float fVar76;
  float fVar77;
  uint uVar78;
  float fVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  vint4 bi;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar101;
  float fVar102;
  vint4 bi_7;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  vint4 bi_4;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1098 [16];
  ulong local_1088;
  RayHit *local_1080;
  Intersectors *local_1078;
  RayQueryContext *local_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1070 = context;
  local_1078 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fe8 = aVar2.x;
    local_ff8 = aVar2.y;
    local_fd8 = aVar2.z;
    auVar22 = dpps((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar60 = rsqrtss(auVar22,auVar22);
    fVar18 = auVar60._0_4_;
    local_fb8[0] = fVar18 * 1.5 - fVar18 * fVar18 * auVar22._0_4_ * 0.5 * fVar18;
    auVar89._0_4_ = local_fe8 * local_fb8[0];
    auVar89._4_4_ = local_ff8 * local_fb8[0];
    auVar89._8_4_ = local_fd8 * local_fb8[0];
    auVar89._12_4_ = aVar2.field_3.w * local_fb8[0];
    uVar13 = CONCAT44(auVar89._4_4_,auVar89._4_4_);
    auVar23._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar23._8_4_ = -auVar89._12_4_;
    auVar23._12_4_ = -auVar89._12_4_;
    auVar80._0_12_ = ZEXT812(0);
    auVar80._12_4_ = 0;
    auVar23 = blendps(auVar23,auVar80,0xe);
    auVar22._4_4_ = auVar23._0_4_;
    auVar22._0_4_ = auVar89._8_4_;
    auVar22._8_4_ = auVar23._4_4_;
    auVar22._12_4_ = 0;
    auVar60._4_4_ = auVar23._0_4_;
    auVar60._0_4_ = auVar89._8_4_;
    auVar60._8_4_ = auVar23._4_4_;
    auVar60._12_4_ = 0;
    auVar93 = dpps(auVar60 << 0x20,auVar22 << 0x20,0x7f);
    uVar13 = CONCAT44(auVar89._12_4_,auVar89._8_4_);
    auVar84._0_8_ = uVar13 ^ 0x8000000080000000;
    auVar84._8_4_ = -auVar89._8_4_;
    auVar84._12_4_ = -auVar89._12_4_;
    auVar23 = insertps(auVar84,auVar89,0x2a);
    auVar60 = dpps(auVar23,auVar23,0x7f);
    iVar17 = -(uint)(auVar60._0_4_ < auVar93._0_4_);
    auVar93._4_4_ = iVar17;
    auVar93._0_4_ = iVar17;
    auVar93._8_4_ = iVar17;
    auVar93._12_4_ = iVar17;
    auVar22 = blendvps(auVar23,auVar22 << 0x20,auVar93);
    auVar60 = dpps(auVar22,auVar22,0x7f);
    auVar23 = rsqrtss(auVar60,auVar60);
    fVar18 = auVar23._0_4_;
    fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * auVar60._0_4_ * 0.5 * fVar18;
    fVar19 = fVar18 * auVar22._0_4_;
    fVar38 = fVar18 * auVar22._4_4_;
    fVar41 = fVar18 * auVar22._8_4_;
    fVar18 = fVar18 * auVar22._12_4_;
    fVar83 = fVar38 * auVar89._0_4_ - auVar89._4_4_ * fVar19;
    fVar90 = fVar41 * auVar89._4_4_ - auVar89._8_4_ * fVar38;
    fVar91 = fVar19 * auVar89._8_4_ - auVar89._0_4_ * fVar41;
    auVar85._12_4_ = fVar18 * auVar89._12_4_ - auVar89._12_4_ * fVar18;
    auVar85._0_8_ = CONCAT44(fVar91,fVar90);
    auVar85._8_4_ = fVar83;
    auVar92._8_4_ = fVar83;
    auVar92._0_8_ = auVar85._0_8_;
    auVar92._12_4_ = auVar85._12_4_;
    auVar22 = dpps(auVar92,auVar85,0x7f);
    auVar60 = rsqrtss(auVar22,auVar22);
    fVar18 = auVar60._0_4_;
    fVar18 = fVar18 * 1.5 - fVar18 * fVar18 * auVar22._0_4_ * 0.5 * fVar18;
    local_f88._4_4_ = fVar18 * fVar83;
    local_f88._0_4_ = fVar41;
    local_f88._8_4_ = auVar89._8_4_ * local_fb8[0];
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar18 * fVar91;
    local_f98._0_4_ = fVar38;
    local_f98._8_4_ = auVar89._4_4_ * local_fb8[0];
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar18 * fVar90;
    local_fa8._0_4_ = fVar19;
    local_fa8._8_4_ = auVar89._0_4_ * local_fb8[0];
    local_fa8._12_4_ = 0;
    pauVar14 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar19 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar38 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar41 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar83 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    fVar18 = 0.0;
    if (0.0 <= fVar83) {
      fVar18 = fVar83;
    }
    fVar83 = (ray->super_RayK<1>).tfar;
    fVar90 = 0.0;
    if (0.0 <= fVar83) {
      fVar90 = fVar83;
    }
    auVar24._4_4_ = -(uint)(ABS(local_ff8) < DAT_01f80d30._4_4_);
    auVar24._0_4_ = -(uint)(ABS(local_fe8) < (float)DAT_01f80d30);
    auVar24._8_4_ = -(uint)(ABS(local_fd8) < DAT_01f80d30._8_4_);
    auVar24._12_4_ = -(uint)(ABS(aVar2.field_3.w) < DAT_01f80d30._12_4_);
    auVar60 = blendvps((undefined1  [16])aVar2,_DAT_01f80d30,auVar24);
    auVar22 = rcpps(auVar24,auVar60);
    fVar95 = auVar22._0_4_;
    fVar96 = auVar22._4_4_;
    fVar97 = auVar22._8_4_;
    fVar95 = (1.0 - auVar60._0_4_ * fVar95) * fVar95 + fVar95;
    fVar96 = (1.0 - auVar60._4_4_ * fVar96) * fVar96 + fVar96;
    fVar97 = (1.0 - auVar60._8_4_ * fVar97) * fVar97 + fVar97;
    fStack_fe4 = local_fe8;
    fStack_fe0 = local_fe8;
    fStack_fdc = local_fe8;
    fStack_ff4 = local_ff8;
    fStack_ff0 = local_ff8;
    fStack_fec = local_ff8;
    fStack_fd4 = local_fd8;
    fStack_fd0 = local_fd8;
    fStack_fcc = local_fd8;
    uVar13 = (ulong)(fVar95 < 0.0) << 4;
    uVar15 = (ulong)(fVar96 < 0.0) << 4 | 0x20;
    uVar16 = (ulong)(fVar97 < 0.0) << 4 | 0x40;
    uVar12 = uVar13 ^ 0x10;
    auVar94._4_4_ = fVar18;
    auVar94._0_4_ = fVar18;
    auVar94._8_4_ = fVar18;
    auVar94._12_4_ = fVar18;
    local_1080 = ray;
    local_fc8 = fVar41;
    fStack_fc4 = fVar41;
    fStack_fc0 = fVar41;
    fStack_fbc = fVar41;
    local_1018 = auVar94;
    local_1028 = fVar97;
    fStack_1024 = fVar97;
    fStack_1020 = fVar97;
    fStack_101c = fVar97;
    local_1038 = fVar19;
    fStack_1034 = fVar19;
    fStack_1030 = fVar19;
    fStack_102c = fVar19;
    local_1048 = fVar38;
    fStack_1044 = fVar38;
    fStack_1040 = fVar38;
    fStack_103c = fVar38;
    local_1088 = uVar13;
    local_1058 = fVar95;
    fStack_1054 = fVar95;
    fStack_1050 = fVar95;
    fStack_104c = fVar95;
    local_1068 = fVar96;
    fStack_1064 = fVar96;
    fStack_1060 = fVar96;
    fStack_105c = fVar96;
    fVar18 = fVar90;
    fVar83 = fVar90;
    fVar91 = fVar90;
    fVar106 = fVar95;
    fVar48 = fVar95;
    fVar53 = fVar95;
    fVar58 = fVar97;
    fVar59 = fVar97;
    fVar63 = fVar97;
    fVar107 = fVar41;
    fVar108 = fVar41;
    fVar109 = fVar41;
    fVar64 = fVar38;
    fVar65 = fVar38;
    fVar68 = fVar38;
    fVar73 = fVar19;
    fVar76 = fVar19;
    fVar79 = fVar19;
    fVar98 = fVar96;
    fVar101 = fVar96;
    fVar102 = fVar96;
    do {
      pauVar7 = pauVar14 + -1;
      pauVar14 = pauVar14 + -1;
      pfVar1 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar7 + 8) < *pfVar1 || *(float *)((long)*pauVar7 + 8) == *pfVar1) {
        uVar10 = *(ulong *)*pauVar14;
LAB_00d8a8c3:
        iVar8 = (int)(uVar10 & 0xf);
        iVar17 = auVar94._12_4_;
        if ((uVar10 & 0xf) == 0) {
          pfVar1 = (float *)(uVar10 + 0x20 + uVar13);
          fVar20 = (*pfVar1 - fVar19) * fVar95;
          fVar39 = (pfVar1[1] - fVar73) * fVar106;
          fVar42 = (pfVar1[2] - fVar76) * fVar48;
          fVar44 = (pfVar1[3] - fVar79) * fVar53;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar15);
          fVar46 = (*pfVar1 - fVar38) * fVar96;
          fVar51 = (pfVar1[1] - fVar64) * fVar98;
          fVar54 = (pfVar1[2] - fVar65) * fVar101;
          fVar56 = (pfVar1[3] - fVar68) * fVar102;
          uVar47 = (uint)((int)fVar46 < (int)fVar20) * (int)fVar20 |
                   (uint)((int)fVar46 >= (int)fVar20) * (int)fVar46;
          uVar52 = (uint)((int)fVar51 < (int)fVar39) * (int)fVar39 |
                   (uint)((int)fVar51 >= (int)fVar39) * (int)fVar51;
          uVar55 = (uint)((int)fVar54 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar54 >= (int)fVar42) * (int)fVar54;
          uVar57 = (uint)((int)fVar56 < (int)fVar44) * (int)fVar44 |
                   (uint)((int)fVar56 >= (int)fVar44) * (int)fVar56;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar16);
          fVar20 = (*pfVar1 - fVar41) * fVar97;
          fVar39 = (pfVar1[1] - fVar107) * fVar58;
          fVar42 = (pfVar1[2] - fVar108) * fVar59;
          fVar44 = (pfVar1[3] - fVar109) * fVar63;
          pfVar1 = (float *)(uVar10 + 0x20 + uVar12);
          fVar46 = (*pfVar1 - fVar19) * fVar95;
          fVar51 = (pfVar1[1] - fVar73) * fVar106;
          fVar54 = (pfVar1[2] - fVar76) * fVar48;
          fVar56 = (pfVar1[3] - fVar79) * fVar53;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar15 ^ 0x10));
          fVar66 = (*pfVar1 - fVar38) * fVar96;
          fVar71 = (pfVar1[1] - fVar64) * fVar98;
          fVar74 = (pfVar1[2] - fVar65) * fVar101;
          fVar77 = (pfVar1[3] - fVar68) * fVar102;
          uVar67 = (uint)((int)fVar46 < (int)fVar66) * (int)fVar46 |
                   (uint)((int)fVar46 >= (int)fVar66) * (int)fVar66;
          uVar72 = (uint)((int)fVar51 < (int)fVar71) * (int)fVar51 |
                   (uint)((int)fVar51 >= (int)fVar71) * (int)fVar71;
          uVar75 = (uint)((int)fVar54 < (int)fVar74) * (int)fVar54 |
                   (uint)((int)fVar54 >= (int)fVar74) * (int)fVar74;
          uVar78 = (uint)((int)fVar56 < (int)fVar77) * (int)fVar56 |
                   (uint)((int)fVar56 >= (int)fVar77) * (int)fVar77;
          pfVar1 = (float *)(uVar10 + 0x20 + (uVar16 ^ 0x10));
          fVar46 = (*pfVar1 - fVar41) * fVar97;
          fVar51 = (pfVar1[1] - fVar107) * fVar58;
          fVar54 = (pfVar1[2] - fVar108) * fVar59;
          fVar56 = (pfVar1[3] - fVar109) * fVar63;
          iVar6 = auVar94._0_4_;
          uVar21 = (uint)((int)fVar20 < iVar6) * iVar6 | (uint)((int)fVar20 >= iVar6) * (int)fVar20;
          iVar6 = auVar94._4_4_;
          uVar40 = (uint)((int)fVar39 < iVar6) * iVar6 | (uint)((int)fVar39 >= iVar6) * (int)fVar39;
          iVar6 = auVar94._8_4_;
          uVar43 = (uint)((int)fVar42 < iVar6) * iVar6 | (uint)((int)fVar42 >= iVar6) * (int)fVar42;
          uVar45 = (uint)((int)fVar44 < iVar17) * iVar17 |
                   (uint)((int)fVar44 >= iVar17) * (int)fVar44;
          local_1098._0_4_ =
               ((int)uVar21 < (int)uVar47) * uVar47 | ((int)uVar21 >= (int)uVar47) * uVar21;
          local_1098._4_4_ =
               ((int)uVar40 < (int)uVar52) * uVar52 | ((int)uVar40 >= (int)uVar52) * uVar40;
          local_1098._8_4_ =
               ((int)uVar43 < (int)uVar55) * uVar55 | ((int)uVar43 >= (int)uVar55) * uVar43;
          local_1098._12_4_ =
               ((int)uVar45 < (int)uVar57) * uVar57 | ((int)uVar45 >= (int)uVar57) * uVar45;
          uVar21 = (uint)((int)fVar90 < (int)fVar46) * (int)fVar90 |
                   (uint)((int)fVar90 >= (int)fVar46) * (int)fVar46;
          uVar40 = (uint)((int)fVar18 < (int)fVar51) * (int)fVar18 |
                   (uint)((int)fVar18 >= (int)fVar51) * (int)fVar51;
          uVar43 = (uint)((int)fVar83 < (int)fVar54) * (int)fVar83 |
                   (uint)((int)fVar83 >= (int)fVar54) * (int)fVar54;
          uVar45 = (uint)((int)fVar91 < (int)fVar56) * (int)fVar91 |
                   (uint)((int)fVar91 >= (int)fVar56) * (int)fVar56;
          auVar25._0_4_ =
               -(uint)((int)(((int)uVar67 < (int)uVar21) * uVar67 |
                            ((int)uVar67 >= (int)uVar21) * uVar21) < (int)local_1098._0_4_);
          auVar25._4_4_ =
               -(uint)((int)(((int)uVar72 < (int)uVar40) * uVar72 |
                            ((int)uVar72 >= (int)uVar40) * uVar40) < (int)local_1098._4_4_);
          auVar25._8_4_ =
               -(uint)((int)(((int)uVar75 < (int)uVar43) * uVar75 |
                            ((int)uVar75 >= (int)uVar43) * uVar43) < (int)local_1098._8_4_);
          auVar25._12_4_ =
               -(uint)((int)(((int)uVar78 < (int)uVar45) * uVar78 |
                            ((int)uVar78 >= (int)uVar45) * uVar45) < (int)local_1098._12_4_);
          uVar9 = movmskps(iVar8,auVar25);
          context = (RayQueryContext *)(ulong)(byte)((byte)uVar9 ^ 0xf);
        }
        else {
          if (iVar8 != 2) {
            (**(code **)((long)local_1078->leafIntersector +
                        (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40))
                      (local_fb8,ray,local_1070);
            fVar90 = (local_1080->super_RayK<1>).tfar;
            context = extraout_RDX;
            ray = local_1080;
            uVar13 = local_1088;
            fVar18 = fVar90;
            fVar83 = fVar90;
            fVar91 = fVar90;
            auVar94 = local_1018;
            fVar95 = local_1058;
            fVar106 = fStack_1054;
            fVar48 = fStack_1050;
            fVar53 = fStack_104c;
            fVar97 = local_1028;
            fVar58 = fStack_1024;
            fVar59 = fStack_1020;
            fVar63 = fStack_101c;
            fVar41 = local_fc8;
            fVar107 = fStack_fc4;
            fVar108 = fStack_fc0;
            fVar109 = fStack_fbc;
            fVar38 = local_1048;
            fVar64 = fStack_1044;
            fVar65 = fStack_1040;
            fVar68 = fStack_103c;
            fVar19 = local_1038;
            fVar73 = fStack_1034;
            fVar76 = fStack_1030;
            fVar79 = fStack_102c;
            fVar96 = local_1068;
            fVar98 = fStack_1064;
            fVar101 = fStack_1060;
            fVar102 = fStack_105c;
            goto LAB_00d8ae1e;
          }
          uVar11 = uVar10 & 0xfffffffffffffff0;
          local_1008 = *(float *)(uVar11 + 0x70);
          fStack_1004 = *(float *)(uVar11 + 0x74);
          fStack_1000 = *(float *)(uVar11 + 0x78);
          fStack_ffc = *(float *)(uVar11 + 0x7c);
          auVar99._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x20) +
               local_ff8 * *(float *)(uVar11 + 0x50) + local_fd8 * *(float *)(uVar11 + 0x80);
          auVar99._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x24) +
               fStack_ff4 * *(float *)(uVar11 + 0x54) + fStack_fd4 * *(float *)(uVar11 + 0x84);
          auVar99._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x28) +
               fStack_ff0 * *(float *)(uVar11 + 0x58) + fStack_fd0 * *(float *)(uVar11 + 0x88);
          auVar99._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x2c) +
               fStack_fec * *(float *)(uVar11 + 0x5c) + fStack_fcc * *(float *)(uVar11 + 0x8c);
          auVar103._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x30) +
               local_ff8 * *(float *)(uVar11 + 0x60) + local_fd8 * *(float *)(uVar11 + 0x90);
          auVar103._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x34) +
               fStack_ff4 * *(float *)(uVar11 + 100) + fStack_fd4 * *(float *)(uVar11 + 0x94);
          auVar103._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x38) +
               fStack_ff0 * *(float *)(uVar11 + 0x68) + fStack_fd0 * *(float *)(uVar11 + 0x98);
          auVar103._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x3c) +
               fStack_fec * *(float *)(uVar11 + 0x6c) + fStack_fcc * *(float *)(uVar11 + 0x9c);
          auVar105._0_4_ =
               local_fe8 * *(float *)(uVar11 + 0x40) +
               local_ff8 * local_1008 + local_fd8 * *(float *)(uVar11 + 0xa0);
          auVar105._4_4_ =
               fStack_fe4 * *(float *)(uVar11 + 0x44) +
               fStack_ff4 * fStack_1004 + fStack_fd4 * *(float *)(uVar11 + 0xa4);
          auVar105._8_4_ =
               fStack_fe0 * *(float *)(uVar11 + 0x48) +
               fStack_ff0 * fStack_1000 + fStack_fd0 * *(float *)(uVar11 + 0xa8);
          auVar105._12_4_ =
               fStack_fdc * *(float *)(uVar11 + 0x4c) +
               fStack_fec * fStack_ffc + fStack_fcc * *(float *)(uVar11 + 0xac);
          fVar19 = (float)DAT_01f80d30;
          fVar38 = DAT_01f80d30._4_4_;
          fVar95 = DAT_01f80d30._8_4_;
          fVar106 = DAT_01f80d30._12_4_;
          auVar26._4_4_ = -(uint)(ABS(auVar99._4_4_) < fVar38);
          auVar26._0_4_ = -(uint)(ABS(auVar99._0_4_) < fVar19);
          auVar26._8_4_ = -(uint)(ABS(auVar99._8_4_) < fVar95);
          auVar26._12_4_ = -(uint)(ABS(auVar99._12_4_) < fVar106);
          auVar22 = blendvps(auVar99,_DAT_01f80d30,auVar26);
          auVar27._4_4_ = -(uint)(ABS(auVar103._4_4_) < fVar38);
          auVar27._0_4_ = -(uint)(ABS(auVar103._0_4_) < fVar19);
          auVar27._8_4_ = -(uint)(ABS(auVar103._8_4_) < fVar95);
          auVar27._12_4_ = -(uint)(ABS(auVar103._12_4_) < fVar106);
          auVar60 = blendvps(auVar103,_DAT_01f80d30,auVar27);
          auVar28._4_4_ = -(uint)(ABS(auVar105._4_4_) < fVar38);
          auVar28._0_4_ = -(uint)(ABS(auVar105._0_4_) < fVar19);
          auVar28._8_4_ = -(uint)(ABS(auVar105._8_4_) < fVar95);
          auVar28._12_4_ = -(uint)(ABS(auVar105._12_4_) < fVar106);
          auVar23 = blendvps(auVar105,_DAT_01f80d30,auVar28);
          auVar93 = rcpps(_DAT_01f80d30,auVar22);
          fVar19 = auVar93._0_4_;
          fVar38 = auVar93._4_4_;
          fVar95 = auVar93._8_4_;
          fVar106 = auVar93._12_4_;
          fVar19 = (1.0 - auVar22._0_4_ * fVar19) * fVar19 + fVar19;
          fVar38 = (1.0 - auVar22._4_4_ * fVar38) * fVar38 + fVar38;
          fVar95 = (1.0 - auVar22._8_4_ * fVar95) * fVar95 + fVar95;
          fVar106 = (1.0 - auVar22._12_4_ * fVar106) * fVar106 + fVar106;
          auVar22 = rcpps(auVar93,auVar60);
          fVar98 = auVar22._0_4_;
          fVar101 = auVar22._4_4_;
          fVar102 = auVar22._8_4_;
          fVar96 = auVar22._12_4_;
          fVar98 = (1.0 - auVar60._0_4_ * fVar98) * fVar98 + fVar98;
          fVar101 = (1.0 - auVar60._4_4_ * fVar101) * fVar101 + fVar101;
          fVar102 = (1.0 - auVar60._8_4_ * fVar102) * fVar102 + fVar102;
          fVar96 = (1.0 - auVar60._12_4_ * fVar96) * fVar96 + fVar96;
          auVar22 = rcpps(auVar22,auVar23);
          fVar20 = auVar22._0_4_;
          fVar39 = auVar22._4_4_;
          fVar42 = auVar22._8_4_;
          fVar44 = auVar22._12_4_;
          fVar20 = (1.0 - auVar23._0_4_ * fVar20) * fVar20 + fVar20;
          fVar39 = (1.0 - auVar23._4_4_ * fVar39) * fVar39 + fVar39;
          fVar42 = (1.0 - auVar23._8_4_ * fVar42) * fVar42 + fVar42;
          fVar44 = (1.0 - auVar23._12_4_ * fVar44) * fVar44 + fVar44;
          fVar68 = (*(float *)(uVar11 + 0x20) * local_1038 +
                   *(float *)(uVar11 + 0x50) * local_1048 +
                   *(float *)(uVar11 + 0x80) * fVar41 + *(float *)(uVar11 + 0xb0)) * -fVar19;
          fVar73 = (*(float *)(uVar11 + 0x24) * fStack_1034 +
                   *(float *)(uVar11 + 0x54) * fStack_1044 +
                   *(float *)(uVar11 + 0x84) * fVar107 + *(float *)(uVar11 + 0xb4)) * -fVar38;
          fVar76 = (*(float *)(uVar11 + 0x28) * fStack_1030 +
                   *(float *)(uVar11 + 0x58) * fStack_1040 +
                   *(float *)(uVar11 + 0x88) * fVar108 + *(float *)(uVar11 + 0xb8)) * -fVar95;
          fVar79 = (*(float *)(uVar11 + 0x2c) * fStack_102c +
                   *(float *)(uVar11 + 0x5c) * fStack_103c +
                   *(float *)(uVar11 + 0x8c) * fVar109 + *(float *)(uVar11 + 0xbc)) * -fVar106;
          fVar59 = (*(float *)(uVar11 + 0x30) * local_1038 +
                   *(float *)(uVar11 + 0x60) * local_1048 +
                   *(float *)(uVar11 + 0x90) * fVar41 + *(float *)(uVar11 + 0xc0)) * -fVar98;
          fVar63 = (*(float *)(uVar11 + 0x34) * fStack_1034 +
                   *(float *)(uVar11 + 100) * fStack_1044 +
                   *(float *)(uVar11 + 0x94) * fVar107 + *(float *)(uVar11 + 0xc4)) * -fVar101;
          fVar64 = (*(float *)(uVar11 + 0x38) * fStack_1030 +
                   *(float *)(uVar11 + 0x68) * fStack_1040 +
                   *(float *)(uVar11 + 0x98) * fVar108 + *(float *)(uVar11 + 200)) * -fVar102;
          fVar65 = (*(float *)(uVar11 + 0x3c) * fStack_102c +
                   *(float *)(uVar11 + 0x6c) * fStack_103c +
                   *(float *)(uVar11 + 0x9c) * fVar109 + *(float *)(uVar11 + 0xcc)) * -fVar96;
          fVar48 = (*(float *)(uVar11 + 0x40) * local_1038 +
                   local_1008 * local_1048 +
                   *(float *)(uVar11 + 0xa0) * fVar41 + *(float *)(uVar11 + 0xd0)) * -fVar20;
          fVar53 = (*(float *)(uVar11 + 0x44) * fStack_1034 +
                   fStack_1004 * fStack_1044 +
                   *(float *)(uVar11 + 0xa4) * fVar107 + *(float *)(uVar11 + 0xd4)) * -fVar39;
          fVar97 = (*(float *)(uVar11 + 0x48) * fStack_1030 +
                   fStack_1000 * fStack_1040 +
                   *(float *)(uVar11 + 0xa8) * fVar108 + *(float *)(uVar11 + 0xd8)) * -fVar42;
          fVar58 = (*(float *)(uVar11 + 0x4c) * fStack_102c +
                   fStack_ffc * fStack_103c +
                   *(float *)(uVar11 + 0xac) * fVar109 + *(float *)(uVar11 + 0xdc)) * -fVar44;
          fVar19 = fVar19 + fVar68;
          fVar38 = fVar38 + fVar73;
          fVar95 = fVar95 + fVar76;
          fVar106 = fVar106 + fVar79;
          fVar98 = fVar98 + fVar59;
          fVar101 = fVar101 + fVar63;
          fVar102 = fVar102 + fVar64;
          fVar96 = fVar96 + fVar65;
          fVar20 = fVar20 + fVar48;
          fVar39 = fVar39 + fVar53;
          fVar42 = fVar42 + fVar97;
          fVar44 = fVar44 + fVar58;
          auVar81._0_4_ =
               (uint)((int)fVar98 < (int)fVar59) * (int)fVar98 |
               (uint)((int)fVar98 >= (int)fVar59) * (int)fVar59;
          auVar81._4_4_ =
               (uint)((int)fVar101 < (int)fVar63) * (int)fVar101 |
               (uint)((int)fVar101 >= (int)fVar63) * (int)fVar63;
          auVar81._8_4_ =
               (uint)((int)fVar102 < (int)fVar64) * (int)fVar102 |
               (uint)((int)fVar102 >= (int)fVar64) * (int)fVar64;
          auVar81._12_4_ =
               (uint)((int)fVar96 < (int)fVar65) * (int)fVar96 |
               (uint)((int)fVar96 >= (int)fVar65) * (int)fVar65;
          auVar86._0_4_ =
               (uint)((int)fVar20 < (int)fVar48) * (int)fVar20 |
               (uint)((int)fVar20 >= (int)fVar48) * (int)fVar48;
          auVar86._4_4_ =
               (uint)((int)fVar39 < (int)fVar53) * (int)fVar39 |
               (uint)((int)fVar39 >= (int)fVar53) * (int)fVar53;
          auVar86._8_4_ =
               (uint)((int)fVar42 < (int)fVar97) * (int)fVar42 |
               (uint)((int)fVar42 >= (int)fVar97) * (int)fVar97;
          auVar86._12_4_ =
               (uint)((int)fVar44 < (int)fVar58) * (int)fVar44 |
               (uint)((int)fVar44 >= (int)fVar58) * (int)fVar58;
          auVar60 = maxps(auVar81,auVar86);
          auVar87._0_4_ =
               (uint)((int)fVar19 < (int)fVar68) * (int)fVar19 |
               (uint)((int)fVar19 >= (int)fVar68) * (int)fVar68;
          auVar87._4_4_ =
               (uint)((int)fVar38 < (int)fVar73) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar73) * (int)fVar73;
          auVar87._8_4_ =
               (uint)((int)fVar95 < (int)fVar76) * (int)fVar95 |
               (uint)((int)fVar95 >= (int)fVar76) * (int)fVar76;
          auVar87._12_4_ =
               (uint)((int)fVar106 < (int)fVar79) * (int)fVar106 |
               (uint)((int)fVar106 >= (int)fVar79) * (int)fVar79;
          auVar29._0_4_ =
               (uint)((int)fVar19 < (int)fVar68) * (int)fVar68 |
               (uint)((int)fVar19 >= (int)fVar68) * (int)fVar19;
          auVar29._4_4_ =
               (uint)((int)fVar38 < (int)fVar73) * (int)fVar73 |
               (uint)((int)fVar38 >= (int)fVar73) * (int)fVar38;
          auVar29._8_4_ =
               (uint)((int)fVar95 < (int)fVar76) * (int)fVar76 |
               (uint)((int)fVar95 >= (int)fVar76) * (int)fVar95;
          auVar29._12_4_ =
               (uint)((int)fVar106 < (int)fVar79) * (int)fVar79 |
               (uint)((int)fVar106 >= (int)fVar79) * (int)fVar106;
          auVar100._0_4_ =
               (uint)((int)fVar98 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar98 >= (int)fVar59) * (int)fVar98;
          auVar100._4_4_ =
               (uint)((int)fVar101 < (int)fVar63) * (int)fVar63 |
               (uint)((int)fVar101 >= (int)fVar63) * (int)fVar101;
          auVar100._8_4_ =
               (uint)((int)fVar102 < (int)fVar64) * (int)fVar64 |
               (uint)((int)fVar102 >= (int)fVar64) * (int)fVar102;
          auVar100._12_4_ =
               (uint)((int)fVar96 < (int)fVar65) * (int)fVar65 |
               (uint)((int)fVar96 >= (int)fVar65) * (int)fVar96;
          auVar104._0_4_ =
               (uint)((int)fVar20 < (int)fVar48) * (int)fVar48 |
               (uint)((int)fVar20 >= (int)fVar48) * (int)fVar20;
          auVar104._4_4_ =
               (uint)((int)fVar39 < (int)fVar53) * (int)fVar53 |
               (uint)((int)fVar39 >= (int)fVar53) * (int)fVar39;
          auVar104._8_4_ =
               (uint)((int)fVar42 < (int)fVar97) * (int)fVar97 |
               (uint)((int)fVar42 >= (int)fVar97) * (int)fVar42;
          auVar104._12_4_ =
               (uint)((int)fVar44 < (int)fVar58) * (int)fVar58 |
               (uint)((int)fVar44 >= (int)fVar58) * (int)fVar44;
          auVar23 = minps(auVar100,auVar104);
          auVar22 = maxps(local_1018,auVar87);
          local_1098 = maxps(auVar22,auVar60);
          auVar61._4_4_ = fVar18;
          auVar61._0_4_ = fVar90;
          auVar61._8_4_ = fVar83;
          auVar61._12_4_ = fVar91;
          auVar22 = minps(auVar61,auVar29);
          auVar22 = minps(auVar22,auVar23);
          auVar49._4_4_ = -(uint)(local_1098._4_4_ <= auVar22._4_4_);
          auVar49._0_4_ = -(uint)(local_1098._0_4_ <= auVar22._0_4_);
          auVar49._8_4_ = -(uint)(local_1098._8_4_ <= auVar22._8_4_);
          auVar49._12_4_ = -(uint)(local_1098._12_4_ <= auVar22._12_4_);
          uVar9 = movmskps((int)context,auVar49);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar9);
          auVar94 = local_1018;
          fVar95 = local_1058;
          fVar106 = fStack_1054;
          fVar48 = fStack_1050;
          fVar53 = fStack_104c;
          fVar97 = local_1028;
          fVar58 = fStack_1024;
          fVar59 = fStack_1020;
          fVar63 = fStack_101c;
          fVar38 = local_1048;
          fVar64 = fStack_1044;
          fVar65 = fStack_1040;
          fVar68 = fStack_103c;
          fVar19 = local_1038;
          fVar73 = fStack_1034;
          fVar76 = fStack_1030;
          fVar79 = fStack_102c;
          fVar96 = local_1068;
          fVar98 = fStack_1064;
          fVar101 = fStack_1060;
          fVar102 = fStack_105c;
        }
        if (context == (RayQueryContext *)0x0) goto LAB_00d8ae1e;
        uVar11 = uVar10 & 0xfffffffffffffff0;
        lVar5 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((ulong)context >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar11 + lVar5 * 8);
        uVar21 = (uint)context - 1 & (uint)context;
        if (uVar21 != 0) {
          uVar40 = *(uint *)(local_1098 + lVar5 * 4);
          lVar5 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar3 = *(ulong *)(uVar11 + lVar5 * 8);
          uVar43 = *(uint *)(local_1098 + lVar5 * 4);
          uVar21 = uVar21 - 1 & uVar21;
          context = (RayQueryContext *)(ulong)uVar21;
          if (uVar21 == 0) {
            if (uVar40 < uVar43) {
              *(ulong *)*pauVar14 = uVar3;
              *(uint *)((long)*pauVar14 + 8) = uVar43;
              pauVar14 = pauVar14 + 1;
            }
            else {
              *(ulong *)*pauVar14 = uVar10;
              *(uint *)((long)*pauVar14 + 8) = uVar40;
              uVar10 = uVar3;
              pauVar14 = pauVar14 + 1;
            }
          }
          else {
            auVar50._8_4_ = uVar40;
            auVar50._0_8_ = uVar10;
            auVar50._12_4_ = 0;
            auVar69._8_4_ = uVar43;
            auVar69._0_8_ = uVar3;
            auVar69._12_4_ = 0;
            lVar5 = 0;
            if (context != (RayQueryContext *)0x0) {
              for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            uVar4 = *(undefined8 *)(uVar11 + lVar5 * 8);
            iVar17 = *(int *)(local_1098 + lVar5 * 4);
            auVar62._8_4_ = iVar17;
            auVar62._0_8_ = uVar4;
            auVar62._12_4_ = 0;
            uVar21 = uVar21 - 1 & uVar21;
            if (uVar21 == 0) {
              auVar30._8_4_ = -(uint)((int)uVar40 < (int)uVar43);
              auVar30._4_4_ = auVar30._8_4_;
              auVar30._0_4_ = auVar30._8_4_;
              auVar30._12_4_ = auVar30._8_4_;
              auVar82._8_4_ = uVar43;
              auVar82._0_8_ = uVar3;
              auVar82._12_4_ = 0;
              auVar60 = blendvps(auVar82,auVar50,auVar30);
              auVar22 = blendvps(auVar50,auVar69,auVar30);
              auVar31._8_4_ = -(uint)(auVar60._8_4_ < iVar17);
              auVar31._4_4_ = auVar31._8_4_;
              auVar31._0_4_ = auVar31._8_4_;
              auVar31._12_4_ = auVar31._8_4_;
              auVar70._8_4_ = iVar17;
              auVar70._0_8_ = uVar4;
              auVar70._12_4_ = 0;
              auVar23 = blendvps(auVar70,auVar60,auVar31);
              auVar93 = blendvps(auVar60,auVar62,auVar31);
              auVar32._8_4_ = -(uint)(auVar22._8_4_ < auVar93._8_4_);
              auVar32._4_4_ = auVar32._8_4_;
              auVar32._0_4_ = auVar32._8_4_;
              auVar32._12_4_ = auVar32._8_4_;
              auVar60 = blendvps(auVar93,auVar22,auVar32);
              auVar22 = blendvps(auVar22,auVar93,auVar32);
              *pauVar14 = auVar22;
              pauVar14[1] = auVar60;
              uVar10 = auVar23._0_8_;
              pauVar14 = pauVar14 + 2;
            }
            else {
              lVar5 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              auVar33._8_4_ = -(uint)((int)uVar40 < (int)uVar43);
              auVar33._4_4_ = auVar33._8_4_;
              auVar33._0_4_ = auVar33._8_4_;
              auVar33._12_4_ = auVar33._8_4_;
              auVar93 = blendvps(auVar69,auVar50,auVar33);
              auVar22 = blendvps(auVar50,auVar69,auVar33);
              auVar88._8_4_ = *(int *)(local_1098 + lVar5 * 4);
              auVar88._0_8_ = *(undefined8 *)(uVar11 + lVar5 * 8);
              auVar88._12_4_ = 0;
              auVar34._8_4_ = -(uint)(iVar17 < *(int *)(local_1098 + lVar5 * 4));
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar23 = blendvps(auVar88,auVar62,auVar34);
              auVar60 = blendvps(auVar62,auVar88,auVar34);
              auVar35._8_4_ = -(uint)(auVar22._8_4_ < auVar60._8_4_);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar89 = blendvps(auVar60,auVar22,auVar35);
              auVar22 = blendvps(auVar22,auVar60,auVar35);
              auVar36._8_4_ = -(uint)(auVar93._8_4_ < auVar23._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              auVar60 = blendvps(auVar23,auVar93,auVar36);
              auVar93 = blendvps(auVar93,auVar23,auVar36);
              auVar37._8_4_ = -(uint)(auVar93._8_4_ < auVar89._8_4_);
              auVar37._4_4_ = auVar37._8_4_;
              auVar37._0_4_ = auVar37._8_4_;
              auVar37._12_4_ = auVar37._8_4_;
              auVar23 = blendvps(auVar89,auVar93,auVar37);
              auVar93 = blendvps(auVar93,auVar89,auVar37);
              *pauVar14 = auVar22;
              pauVar14[1] = auVar93;
              pauVar14[2] = auVar23;
              uVar10 = auVar60._0_8_;
              pauVar14 = pauVar14 + 3;
            }
          }
        }
        goto LAB_00d8a8c3;
      }
LAB_00d8ae1e:
    } while (pauVar14 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }